

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_encode_memory
               (uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGColorType colortype,
               uint bitdepth)

{
  uint uVar1;
  LodePNGState local_1c0;
  
  local_1c0._vptr_LodePNGState = (_func_int **)&PTR__LodePNGState_00119d08;
  local_1c0.decoder.zlibsettings.ignore_adler32 = 0;
  local_1c0.decoder.zlibsettings.custom_zlib =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
  local_1c0.decoder.zlibsettings.custom_inflate._0_4_ = 0;
  local_1c0.decoder.zlibsettings.custom_inflate._4_4_ = 0;
  local_1c0.decoder.zlibsettings.custom_context._0_4_ = 0;
  local_1c0.decoder._28_8_ = 0;
  local_1c0.decoder.color_convert = 1;
  local_1c0.decoder.read_text_chunks = 1;
  local_1c0.decoder.remember_unknown_chunks = 0;
  local_1c0.encoder.zlibsettings.btype = 2;
  local_1c0.encoder.zlibsettings.use_lz77 = 1;
  local_1c0.encoder.zlibsettings.windowsize = 0x800;
  local_1c0.encoder.zlibsettings.minmatch = 3;
  local_1c0.encoder.zlibsettings.nicematch = 0x80;
  local_1c0.encoder.zlibsettings.lazymatching = 1;
  local_1c0.encoder.zlibsettings.custom_zlib =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
  local_1c0.encoder.zlibsettings.custom_deflate =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
  local_1c0.encoder.zlibsettings.custom_context = (void *)0x0;
  local_1c0.encoder.filter_strategy = LFS_MINSUM;
  local_1c0.encoder.auto_convert = 1;
  local_1c0.encoder.filter_palette_zero = 1;
  local_1c0.encoder.predefined_filters = (uchar *)0x0;
  local_1c0.encoder.force_palette = 0;
  local_1c0.encoder.add_id = 0;
  local_1c0.encoder.text_compression = 1;
  local_1c0.info_raw.key_defined = 0;
  local_1c0.info_raw.key_r = 0;
  local_1c0.info_raw.key_g = 0;
  local_1c0.info_raw.key_b = 0;
  local_1c0.info_raw.palette = (uchar *)0x0;
  local_1c0.info_raw.palettesize = 0;
  local_1c0.info_png.color.key_defined = 0;
  local_1c0.info_png.color.key_r = 0;
  local_1c0.info_png.color.key_g = 0;
  local_1c0.info_png.color.key_b = 0;
  local_1c0.info_png.color.palette = (uchar *)0x0;
  local_1c0.info_png.color.palettesize = 0;
  local_1c0.info_png.interlace_method = 0;
  local_1c0.info_png.compression_method = 0;
  local_1c0.info_png.filter_method = 0;
  local_1c0.info_png.phys_defined = 0;
  local_1c0.info_png.unknown_chunks_size[1] = 0;
  local_1c0.info_png.unknown_chunks_size[2] = 0;
  local_1c0.info_png.unknown_chunks_data[2] = (uchar *)0x0;
  local_1c0.info_png.unknown_chunks_size[0] = 0;
  local_1c0.info_png.unknown_chunks_data[0] = (uchar *)0x0;
  local_1c0.info_png.unknown_chunks_data[1] = (uchar *)0x0;
  local_1c0.info_png.time_defined = 0;
  local_1c0.info_png.itext_transkeys = (char **)0x0;
  local_1c0.info_png.itext_strings = (char **)0x0;
  local_1c0.info_png.itext_keys = (char **)0x0;
  local_1c0.info_png.itext_langtags = (char **)0x0;
  local_1c0.info_png.text_strings = (char **)0x0;
  local_1c0.info_png.itext_num = 0;
  local_1c0.info_png.text_num = 0;
  local_1c0.info_png.text_keys = (char **)0x0;
  local_1c0.info_png.background_defined = 0;
  local_1c0.info_png.background_r = 0;
  local_1c0.info_png.background_g = 0;
  local_1c0.info_png.background_b = 0;
  local_1c0.error = 1;
  local_1c0.info_raw.bitdepth = bitdepth;
  local_1c0.info_png.color.bitdepth = bitdepth;
  local_1c0.info_raw.colortype = colortype;
  local_1c0.info_png.color.colortype = colortype;
  lodepng_encode(out,outsize,image,w,h,&local_1c0);
  uVar1 = local_1c0.error;
  lodepng_state_cleanup(&local_1c0);
  return uVar1;
}

Assistant:

unsigned lodepng_encode_memory(unsigned char** out, size_t* outsize, const unsigned char* image,
                               unsigned w, unsigned h, LodePNGColorType colortype, unsigned bitdepth)
{
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  state.info_png.color.colortype = colortype;
  state.info_png.color.bitdepth = bitdepth;
  lodepng_encode(out, outsize, image, w, h, &state);
  error = state.error;
  lodepng_state_cleanup(&state);
  return error;
}